

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

char * curl_easy_unescape(CURL *handle,char *string,int length,int *olen)

{
  CURLcode CVar1;
  int iVar2;
  size_t sStack_48;
  CURLcode res;
  size_t outputlen;
  size_t inputlen;
  char *str;
  int *olen_local;
  char *pcStack_20;
  int length_local;
  char *string_local;
  CURL *handle_local;
  
  inputlen = 0;
  outputlen = (size_t)length;
  str = (char *)olen;
  olen_local._4_4_ = length;
  pcStack_20 = string;
  string_local = (char *)handle;
  CVar1 = Curl_urldecode((SessionHandle *)handle,string,outputlen,(char **)&inputlen,
                         &stack0xffffffffffffffb8,false);
  if (CVar1 == CURLE_OK) {
    if (str != (char *)0x0) {
      iVar2 = curlx_uztosi(sStack_48);
      *(int *)str = iVar2;
    }
    handle_local = (CURL *)inputlen;
  }
  else {
    handle_local = (CURL *)0x0;
  }
  return (char *)handle_local;
}

Assistant:

char *curl_easy_unescape(CURL *handle, const char *string, int length,
                         int *olen)
{
  char *str = NULL;
  size_t inputlen = length;
  size_t outputlen;
  CURLcode res = Curl_urldecode(handle, string, inputlen, &str, &outputlen,
                                FALSE);
  if(res)
    return NULL;
  if(olen)
    *olen = curlx_uztosi(outputlen);
  return str;
}